

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

value object_call(object obj,method m,void **args,size_t argc)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  method_conflict in_RSI;
  undefined8 *in_RDI;
  value v;
  value local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x18) == 0)) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = (value)(**(code **)(in_RDI[3] + 0x18))(in_RDI,in_RDI[2],in_RSI,in_RDX,in_RCX);
    if (local_8 == (value)0x0) {
      uVar1 = *in_RDI;
      pcVar2 = method_name(in_RSI);
      log_write_impl_va("metacall",0x14f,"object_call",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s invoke of method %s",uVar1,pcVar2);
      local_8 = (value)0x0;
    }
  }
  return local_8;
}

Assistant:

value object_call(object obj, method m, object_args args, size_t argc)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->method_invoke != NULL)
	{
		value v = obj->interface->method_invoke(obj, obj->impl, m, args, argc);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s invoke of method %s", obj->name, method_name(m));
			return NULL;
		}

		return v;
	}

	return NULL;
}